

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O1

value_type_conflict __thiscall standards::exp_number::operator_cast_to_float(exp_number *this)

{
  value_type_conflict vVar1;
  float fVar2;
  
  if (*(int *)(this + 4) == -1) {
    fVar2 = expf(*(float *)this);
    vVar1 = -fVar2;
  }
  else {
    vVar1 = 0.0;
    if (*(int *)(this + 4) == 1) {
      fVar2 = expf(*(float *)this);
      return fVar2;
    }
  }
  return vVar1;
}

Assistant:

operator value_type() const {
    if (sign_ == is_positive)
      return std::exp(log_);
    else if (sign_ == is_negative)
      return -std::exp(log_);
    else
      return 0;
  }